

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall
QGles2SwapChainTimestamps::tryQueryTimestamps
          (QGles2SwapChainTimestamps *this,int pairIndex,QRhiGles2 *rhiD,double *elapsedSec)

{
  long lVar1;
  int in_ESI;
  GLuint *in_RDI;
  long in_FS_OFFSET;
  quint64 nanoseconds;
  bool result;
  GLuint tsEnd;
  GLuint tsStart;
  GLuint ready;
  quint64 timestamps [2];
  undefined8 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)in_RDI + (long)in_ESI) & 1) != 0) {
    QOpenGLExtraFunctions::glGetQueryObjectuiv
              ((QOpenGLExtraFunctions *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               (GLuint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(GLenum)in_stack_ffffffffffffffa8,
               in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2SwapChainTimestamps::tryQueryTimestamps(int pairIndex, QRhiGles2 *rhiD, double *elapsedSec)
{
    if (!active[pairIndex])
        return false;

    GLuint tsStart = query[pairIndex * 2];
    GLuint tsEnd = query[pairIndex * 2 + 1];

    GLuint ready = GL_FALSE;
    rhiD->f->glGetQueryObjectuiv(tsEnd, GL_QUERY_RESULT_AVAILABLE, &ready);

    if (!ready)
        return false;

    bool result = false;
    quint64 timestamps[2];
    rhiD->glGetQueryObjectui64v(tsStart, GL_QUERY_RESULT, &timestamps[0]);
    rhiD->glGetQueryObjectui64v(tsEnd, GL_QUERY_RESULT, &timestamps[1]);

    if (timestamps[1] >= timestamps[0]) {
        const quint64 nanoseconds = timestamps[1] - timestamps[0];
        *elapsedSec = nanoseconds / 1000000000.0;
        result = true;
    }

    active[pairIndex] = false;
    return result;
}